

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svwaitup.c
# Opt level: O0

int main(int argc,char **argv)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char **ppcVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  char local_88 [8];
  char sulong [40];
  tai now;
  tai when;
  unsigned_long pid;
  int wdir;
  int r;
  int is;
  int fd;
  char status [18];
  int verbose;
  int opt;
  char **argv_local;
  int argc_local;
  
  stack0xffffffffffffffe0 = 0;
  progname = *argv;
LAB_0010230e:
  do {
    iVar2 = sgetoptmine(argc,argv,"s:vV");
    if (iVar2 == subgetoptdone) {
      ppcVar5 = argv + subgetoptind;
      if ((ppcVar5 == (char **)0x0) || (*ppcVar5 == (char *)0x0)) {
        usage();
      }
      iVar2 = open_read(".");
      ppcVar1 = ppcVar5;
      if (iVar2 == -1) {
        fatal("unable to open current working directory");
      }
      while (dir = ppcVar1, *dir != (char *)0x0) {
        if ((dir != ppcVar5) && (iVar3 = fchdir(iVar2), iVar3 == -1)) {
          fatal("unable to switch to starting directory");
        }
        iVar3 = chdir(*dir);
        if (iVar3 == -1) {
          warn(*dir,": unable to change directory: ",&strerr_sys);
          ppcVar1 = dir;
        }
        else {
          iVar3 = open_write("supervise/ok");
          if (iVar3 == -1) {
            piVar6 = __errno_location();
            if (*piVar6 == error_nodevice) {
              warn(*dir,": runsv not running.",(strerr *)0x0);
              ppcVar1 = dir;
            }
            else {
              warn(*dir,": unable to open supervise/ok: ",&strerr_sys);
              ppcVar1 = dir;
            }
          }
          else {
            close(iVar3);
            iVar3 = open_read("supervise/status");
            if (iVar3 == -1) {
              warn(*dir,"unable to open supervise/status: ",&strerr_sys);
              ppcVar1 = dir;
            }
            else {
              uVar4 = buffer_unixread(iVar3,(char *)&is,0x12);
              close(iVar3);
              if (uVar4 < 0x12) {
                if (uVar4 == 0xffffffff) {
                  warn(*dir,"unable to read supervise/status: ",&strerr_sys);
                  ppcVar1 = dir;
                }
                else {
                  warn(*dir,": unable to read supervise/status: bad format.",(strerr *)0x0);
                  ppcVar1 = dir;
                }
              }
              else if ((ulong)(byte)status[4] +
                       ((ulong)(byte)status[5] +
                       ((ulong)(byte)status[6] + (ulong)(byte)status[7] * 0x100) * 0x100) * 0x100 ==
                       0) {
                warn(*dir,": is down.",(strerr *)0x0);
                ppcVar1 = dir;
              }
              else {
                tai_unpack((char *)&is,&now);
                tai_now((tai *)(sulong + 0x20));
                if ((ulong)sulong._32_8_ < now.x) {
                  now.x._0_1_ = sulong[0x20];
                  now.x._1_1_ = sulong[0x21];
                  now.x._2_1_ = sulong[0x22];
                  now.x._3_1_ = sulong[0x23];
                  now.x._4_1_ = sulong[0x24];
                  now.x._5_1_ = sulong[0x25];
                  now.x._6_1_ = sulong[0x26];
                  now.x._7_1_ = sulong[0x27];
                }
                tai_sub(&now,(tai *)(sulong + 0x20),&now);
                auVar7._8_4_ = (int)(now.x >> 0x20);
                auVar7._0_8_ = now.x;
                auVar7._12_4_ = 0x45300000;
                iVar3 = (int)((auVar7._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)now.x) - 4503599627370496.0));
                if ((ulong)(long)iVar3 < sec) {
                  sleep((int)sec - iVar3);
                  ppcVar1 = dir;
                }
                else {
                  if (stack0xffffffffffffffe0 != 0) {
                    uVar4 = fmt_ulong(local_88,(long)iVar3);
                    local_88[uVar4] = '\0';
                    strerr_warn("svwaitup: ",*dir,": is up (",local_88," seconds)",(char *)0x0,
                                (strerr *)0x0);
                  }
                  ppcVar1 = dir + 1;
                }
              }
            }
          }
        }
      }
      iVar3 = fchdir(iVar2);
      if (iVar3 == -1) {
        strerr_warn("svwaitup: warning: ","unable to switch to starting directory: ",(char *)0x0,
                    (char *)0x0,(char *)0x0,(char *)0x0,&strerr_sys);
      }
      close(iVar2);
      if (100 < rc) {
        rc = 100;
      }
      _exit(rc);
    }
    if (iVar2 != 0x3f) {
      if (iVar2 != 0x56) {
        if (iVar2 == 0x73) {
          scan_ulong(subgetoptarg,&sec);
          if ((sec == 0) || (600 < sec)) {
            usage();
          }
        }
        else if (iVar2 == 0x76) {
          stack0xffffffffffffffe0 = 1;
        }
        goto LAB_0010230e;
      }
      strerr_warn("2.1.3",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(strerr *)0x0)
      ;
    }
    usage();
  } while( true );
}

Assistant:

int main(int argc, const char * const *argv) {
  int opt;
  int verbose =0;
  char status[18];
  int fd;
  int is;
  int r;
  int wdir;
  unsigned long pid;
  struct tai when;
  struct tai now;
  char sulong[FMT_ULONG];

  progname =*argv;

  while ((opt =getopt(argc, argv, "s:vV")) != opteof) {
    switch(opt) {
    case 's':
      scan_ulong(optarg, &sec);
      if ((sec < 1) || (sec > 600)) usage();
      break;
    case 'v':
      verbose =1;
      break;
    case 'V':
      strerr_warn1(VERSION, 0);
    case '?':
      usage();
    }
  }
  argv +=optind;
  if (! argv || ! *argv) usage();

  if ((wdir =open_read(".")) == -1)
    fatal("unable to open current working directory");

  dir =argv;
  while (*dir) {
    if (dir != argv)
      if (fchdir(wdir) == -1) fatal("unable to switch to starting directory");
    if (chdir(*dir) == -1) {
      warn(*dir, ": unable to change directory: ", &strerr_sys);
      continue;
    }
    if ((fd =open_write("supervise/ok")) == -1) {
      if (errno == error_nodevice)
        warn(*dir, ": runsv not running.", 0);
      else
        warn(*dir, ": unable to open supervise/ok: ", &strerr_sys);
      continue;
    }
    close(fd);

    if ((fd =open_read("supervise/status")) == -1) {
      warn(*dir, "unable to open supervise/status: ", &strerr_sys);
      continue;
    }
    r =buffer_unixread(fd, status, sizeof status);
    close(fd);
    if (r < sizeof status) {
      if (r == -1)
        warn(*dir, "unable to read supervise/status: ", &strerr_sys);
      else
        warn(*dir, ": unable to read supervise/status: bad format.", 0);
      continue;
    }

    pid =(unsigned char)status[15];
    pid <<=8; pid +=(unsigned char)status[14];
    pid <<=8; pid +=(unsigned char)status[13];
    pid <<=8; pid +=(unsigned char)status[12];
    if (! pid) {
      warn(*dir, ": is down.", 0);
      continue;
    }

    tai_unpack(status, &when);
    tai_now(&now);
    if (tai_less(&now, &when)) when =now;
    tai_sub(&when, &now, &when);
    is =tai_approx(&when);

    if (is >= sec) {
      /* ok */
      if (verbose) {
        sulong[fmt_ulong(sulong, is)] =0;
        strerr_warn5(INFO, *dir, ": is up (", sulong, " seconds)", 0);
      }
      dir++;
      continue;
    }
    sleep(sec -is);
  }
  if (fchdir(wdir) == -1)
    strerr_warn2(WARN, "unable to switch to starting directory: ", &strerr_sys);
  close(wdir);
  if (rc > 100) rc =100;
  _exit(rc);
}